

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_48;
  char *local_30;
  undefined8 local_28;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_48.ptr = (Branch *)(this->text).content.ptr;
  local_48.size_ = (size_t)params->ptr;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_48,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_30 = (this->text).content.ptr;
  local_28 = 0;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_30,nums_00);
  heapString((String *)&local_48,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_48);
  Array<char>::~Array((Array<char> *)&local_48);
  local_30 = (char *)0x0;
  local_28 = 1;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x2;
  sVar1 = kj::_::sum((_ *)&local_30,nums_01);
  local_48.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_48.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_48);
  Array<kj::StringTree::Branch>::~Array(&local_48);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)this,(StringTree *)params);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}